

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O0

void openInputIntervals(string *fPath,
                       vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                       *inp)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  long *plVar5;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  local_288;
  int local_260;
  int local_25c;
  int en;
  int st;
  string chr;
  string local_228 [8];
  fstream fs;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *inp_local;
  string *fPath_local;
  
  std::fstream::fstream(local_228);
  std::fstream::open(local_228,(_Ios_Openmode)fPath);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Could not find input regions file at: ");
    poVar3 = std::operator<<(poVar3,(string *)fPath);
    std::operator<<(poVar3,'\n');
    chr.field_2._8_4_ = 1;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"        Input regions file: ");
    poVar3 = std::operator<<(poVar3,(string *)fPath);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::string((string *)&en);
    while( true ) {
      piVar4 = std::operator>>((istream *)local_228,(string *)&en);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_25c);
      plVar5 = (long *)std::istream::operator>>(piVar4,&local_260);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      if (!bVar2) break;
      std::make_tuple<std::__cxx11::string&,int&,int&>
                (&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&en
                 ,&local_25c,&local_260);
      std::
      vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>
      ::emplace_back<std::tuple<std::__cxx11::string,int,int>>
                ((vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>
                  *)inp,&local_288);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
      ::~tuple(&local_288);
    }
    std::fstream::close();
    std::__cxx11::string::~string((string *)&en);
    chr.field_2._8_4_ = 0;
  }
  std::fstream::~fstream(local_228);
  return;
}

Assistant:

void openInputIntervals(const std::string &fPath, std::vector<std::tuple<std::string, int, int>> &inp)
{
	std::fstream fs;
	fs.open(fPath, std::fstream::in);
	if (!fs.is_open())
	{
		std::cerr << "Could not find input regions file at: " << fPath << '\n';
		return;
	}
	else
	{
		std::cerr << "        Input regions file: " << fPath << '\n';
	}

	std::string chr;
	int st, en;

	while (fs >> chr >> st >> en)
	{
		inp.emplace_back(std::make_tuple(chr, st, en));
	}
	fs.close();
}